

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

Diagnostics * __thiscall slang::ast::Compilation::getAllDiagnostics(Compilation *this)

{
  bool bVar1;
  SourceManager *in_RDI;
  Compilation *in_stack_00000008;
  Compilation *in_stack_000000d8;
  optional<slang::Diagnostics> *in_stack_ffffffffffffffe0;
  SourceManager *this_00;
  Diagnostics *local_8;
  
  this_00 = in_RDI;
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::Diagnostics> *)0x58238f);
  if (bVar1) {
    local_8 = std::optional<slang::Diagnostics>::operator*((optional<slang::Diagnostics> *)0x5823a6)
    ;
  }
  else {
    std::optional<slang::Diagnostics>::emplace<>(in_stack_ffffffffffffffe0);
    std::optional<slang::Diagnostics>::operator->((optional<slang::Diagnostics> *)0x5823d6);
    getParseDiagnostics(in_stack_00000008);
    SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>
              ((SmallVectorBase<slang::Diagnostic> *)this_00,(Diagnostics *)in_RDI);
    std::optional<slang::Diagnostics>::operator->((optional<slang::Diagnostics> *)0x582401);
    getSemanticDiagnostics(in_stack_000000d8);
    SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>
              ((SmallVectorBase<slang::Diagnostic> *)this_00,(Diagnostics *)in_RDI);
    if (in_RDI[3].userDirectories.
        super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::optional<slang::Diagnostics>::operator->((optional<slang::Diagnostics> *)0x58243d);
      Diagnostics::sort((Diagnostics *)this_00,in_RDI);
    }
    local_8 = std::optional<slang::Diagnostics>::operator*((optional<slang::Diagnostics> *)0x582462)
    ;
  }
  return local_8;
}

Assistant:

const Diagnostics& Compilation::getAllDiagnostics() {
    if (cachedAllDiagnostics)
        return *cachedAllDiagnostics;

    SLANG_ASSERT(!isFrozen());

    cachedAllDiagnostics.emplace();
    cachedAllDiagnostics->append_range(getParseDiagnostics());
    cachedAllDiagnostics->append_range(getSemanticDiagnostics());

    if (sourceManager)
        cachedAllDiagnostics->sort(*sourceManager);
    return *cachedAllDiagnostics;
}